

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O3

void ccp_length_op(ccp_context *ctx,void *blk,int len,unsigned_long seq)

{
  uint uVar1;
  long local_8;
  
  uVar1 = (uint)blk;
  local_8 = (long)blk << 0x20;
  (ctx->a_cipher).state[0xc] = 0;
  (ctx->a_cipher).state[0xd] = 0;
  (ctx->a_cipher).state[0xe] = 0;
  uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  (ctx->a_cipher).state[0xf] = uVar1;
  (ctx->a_cipher).currentIndex = 0x40;
  (ctx->b_cipher).state[0xe] = 0;
  (ctx->b_cipher).state[0xf] = uVar1;
  (ctx->b_cipher).currentIndex = 0x40;
  (ctx->b_cipher).state[0xc] = 1;
  (ctx->b_cipher).state[0xd] = 0;
  smemclr(&local_8,8);
  return;
}

Assistant:

static void ccp_length_op(struct ccp_context *ctx, void *blk, int len,
                          unsigned long seq)
{
    unsigned char iv[8];
    /*
     * According to RFC 4253 (section 6.4), the packet sequence number wraps
     * at 2^32, so its 32 high-order bits will always be zero.
     */
    PUT_32BIT_LSB_FIRST(iv, 0);
    PUT_32BIT_LSB_FIRST(iv + 4, seq);
    chacha20_iv(&ctx->a_cipher, iv);
    chacha20_iv(&ctx->b_cipher, iv);
    /* Reset content block count to 1, as the first is the key for Poly1305 */
    ++ctx->b_cipher.state[12];
    smemclr(iv, sizeof(iv));
}